

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O1

h264_macroblock * h264_inter_filter(h264_slice *slice,h264_macroblock *mb,int inter)

{
  if (((inter == 0) && (slice->picparm->constrained_intra_pred_flag != 0)) &&
     (slice->nal_unit_type == 2)) {
    if (0x1a < mb->mb_type) {
      mb = &mb_unavail_inter;
    }
    return mb;
  }
  return mb;
}

Assistant:

const struct h264_macroblock *h264_inter_filter(struct h264_slice *slice, const struct h264_macroblock *mb, int inter) {
	if (!inter
			&& slice->picparm->constrained_intra_pred_flag
			&& slice->nal_unit_type == H264_NAL_UNIT_TYPE_SLICE_PART_A
			&& h264_is_inter_mb_type(mb->mb_type))
		return h264_mb_unavail(1);
	else
		return mb;
}